

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

void __thiscall cmFileLockPool::PushFileScope(cmFileLockPool *this)

{
  ScopePool *local_10;
  
  local_10 = (ScopePool *)operator_new(0x18);
  (local_10->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_10->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_10->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>::
  emplace_back<cmFileLockPool::ScopePool*>
            ((vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>> *)
             &this->FileScopes,&local_10);
  return;
}

Assistant:

void cmFileLockPool::PushFileScope()
{
  this->FileScopes.push_back(new ScopePool());
}